

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomsite.cpp
# Opt level: O2

void __thiscall
CIF::AtomSite::applySymmetry
          (AtomSite *this,vector<CIF::Symmetry,_std::allocator<CIF::Symmetry>_> *symmetryvector)

{
  pointer pSVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer __src;
  byte bVar5;
  Symmetry in_stack_ffffffffffffff08;
  undefined8 local_90 [12];
  
  bVar5 = 0;
  pSVar1 = (symmetryvector->super__Vector_base<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__src = (symmetryvector->super__Vector_base<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>).
               _M_impl.super__Vector_impl_data._M_start; __src != pSVar1; __src = __src + 1) {
    memmove(local_90,__src,0x60);
    puVar3 = local_90;
    puVar4 = (undefined8 *)&stack0xffffffffffffff08;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    applySymmetry(this,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void AtomSite::applySymmetry(std::vector<Symmetry> symmetryvector) {
        for (Symmetry s : symmetryvector)
            applySymmetry(s);
    }